

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O1

uint __thiscall yactfr::internal::TsdlAttr::align(TsdlAttr *this)

{
  ulong uVar1;
  string msg;
  ostream *poVar2;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe50;
  TextLocation in_stack_fffffffffffffe58;
  ostringstream local_188 [376];
  
  checkKind(this,UInt);
  uVar1 = this->uintVal;
  if (uVar1 - 1 < (uVar1 ^ uVar1 - 1)) {
    return (uint)uVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"Invalid `align` attribute (must be a power of two): ",0x34);
  poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::__cxx11::stringbuf::str();
  if ((this->valLoc).super_type.m_initialized != false) {
    msg.field_2._8_8_ = in_stack_fffffffffffffe50;
    msg._0_24_ = (this->valLoc).super_type.m_storage.dummy_;
    throwTextParseError(msg,in_stack_fffffffffffffe58);
  }
  __assert_fail("valLoc",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-attr.hpp"
                ,0x70,"TextLocation yactfr::internal::TsdlAttr::valTextLoc() const");
}

Assistant:

unsigned int TsdlAttr::align() const
{
    this->checkKind(Kind::UInt);

    if (!isPowOfTwo(uintVal)) {
        std::ostringstream ss;

        ss << "Invalid `align` attribute (must be a power of two): " << uintVal << ".";
        throwTextParseError(ss.str(), this->valTextLoc());
    }

    return uintVal;
}